

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::TriangleMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  BufferView<embree::Vec3fa> *pBVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 uVar10;
  long lVar11;
  ulong uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  auVar18._8_4_ = 0x7f800000;
  auVar18._0_8_ = 0x7f8000007f800000;
  auVar18._12_4_ = 0x7f800000;
  auVar19 = ZEXT1664(auVar18);
  auVar16._8_4_ = 0xff800000;
  auVar16._0_8_ = 0xff800000ff800000;
  auVar16._12_4_ = 0xff800000;
  auVar17 = ZEXT1664(auVar16);
  sVar8 = 0;
  auVar20._8_4_ = 0xddccb9a2;
  auVar20._0_8_ = 0xddccb9a2ddccb9a2;
  auVar20._12_4_ = 0xddccb9a2;
  auVar21._8_4_ = 0x5dccb9a2;
  auVar21._0_8_ = 0x5dccb9a25dccb9a2;
  auVar21._12_4_ = 0x5dccb9a2;
  auVar22 = ZEXT1664(auVar16);
  auVar23 = ZEXT1664(auVar18);
  do {
    if (r->_end <= uVar13) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar23._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar22._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar19._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar17._0_16_;
      __return_storage_ptr__->end = sVar8;
      return __return_storage_ptr__;
    }
    lVar11 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
    pBVar1 = (this->super_TriangleMesh).vertices.items;
    lVar15 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar13;
    uVar12 = (ulong)*(uint *)(lVar11 + lVar15);
    uVar2 = (pBVar1->super_RawBufferView).num;
    if (((uVar12 < uVar2) && (uVar9 = (ulong)*(uint *)(lVar11 + 4 + lVar15), uVar9 < uVar2)) &&
       (uVar14 = (ulong)*(uint *)(lVar11 + 8 + lVar15), uVar14 < uVar2)) {
      lVar11 = 0;
      do {
        if ((ulong)(this->super_TriangleMesh).super_Geometry.numTimeSteps * 0x38 + 0x38 ==
            lVar11 + 0x38) {
          pcVar4 = (this->super_TriangleMesh).vertices0.super_RawBufferView.ptr_ofs;
          sVar5 = (this->super_TriangleMesh).vertices0.super_RawBufferView.stride;
          auVar16 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + uVar12 * sVar5),
                               *(undefined1 (*) [16])(pcVar4 + uVar9 * sVar5));
          auVar16 = vminps_avx(auVar16,*(undefined1 (*) [16])(pcVar4 + uVar14 * sVar5));
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar16,ZEXT416(geomID),0x30);
          auVar16 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + uVar12 * sVar5),
                               *(undefined1 (*) [16])(pcVar4 + uVar9 * sVar5));
          auVar16 = vmaxps_avx(auVar16,*(undefined1 (*) [16])(pcVar4 + uVar14 * sVar5));
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar16,ZEXT416((uint)uVar13),0x30);
          auVar16 = vminps_avx((undefined1  [16])auVar23._0_16_,(undefined1  [16])aVar6);
          auVar23 = ZEXT1664(auVar16);
          auVar16 = vmaxps_avx((undefined1  [16])auVar22._0_16_,(undefined1  [16])aVar7);
          auVar22 = ZEXT1664(auVar16);
          auVar24._0_4_ = aVar6.x + aVar7.x;
          auVar24._4_4_ = aVar6.y + aVar7.y;
          auVar24._8_4_ = aVar6.z + aVar7.z;
          auVar24._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
          auVar16 = vminps_avx((undefined1  [16])auVar19._0_16_,auVar24);
          auVar19 = ZEXT1664(auVar16);
          auVar16 = vmaxps_avx((undefined1  [16])auVar17._0_16_,auVar24);
          auVar17 = ZEXT1664(auVar16);
          sVar8 = sVar8 + 1;
          prims[k].upper.field_0.field_1 = aVar7;
          prims[k].lower.field_0.field_1 = aVar6;
          k = k + 1;
          break;
        }
        lVar15 = *(long *)((long)&(pBVar1->super_RawBufferView).ptr_ofs + lVar11);
        lVar3 = *(long *)((long)&(pBVar1->super_RawBufferView).stride + lVar11);
        auVar16 = *(undefined1 (*) [16])(lVar15 + lVar3 * uVar12);
        auVar18 = vcmpps_avx(auVar16,auVar20,6);
        auVar16 = vcmpps_avx(auVar16,auVar21,1);
        auVar16 = vandps_avx(auVar18,auVar16);
        uVar10 = vmovmskps_avx(auVar16);
        if ((~(byte)uVar10 & 7) != 0) break;
        auVar16 = *(undefined1 (*) [16])(lVar15 + lVar3 * uVar9);
        auVar18 = vcmpps_avx(auVar16,auVar20,6);
        auVar16 = vcmpps_avx(auVar16,auVar21,1);
        auVar16 = vandps_avx(auVar18,auVar16);
        uVar10 = vmovmskps_avx(auVar16);
        if ((~(byte)uVar10 & 7) != 0) break;
        auVar16 = *(undefined1 (*) [16])(lVar15 + lVar3 * uVar14);
        auVar18 = vcmpps_avx(auVar16,auVar20,6);
        auVar16 = vcmpps_avx(auVar16,auVar21,1);
        auVar16 = vandps_avx(auVar18,auVar16);
        uVar10 = vmovmskps_avx(auVar16);
        lVar11 = lVar11 + 0x38;
      } while ((~(byte)uVar10 & 7) == 0);
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }